

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

shared_ptr<kratos::InterfaceRef> __thiscall
kratos::Generator::get_interface(Generator *this,string *interface_name)

{
  size_type *psVar1;
  pointer ppVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<kratos::InterfaceRef> sVar6;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
                  *)&interface_name[0x24]._M_string_length,in_RDX);
  if (cVar3._M_node == (_Base_ptr)&interface_name[0x24].field_2) {
    (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var5._M_pi = extraout_RDX;
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
                   *)&interface_name[0x24]._M_string_length,in_RDX);
    (this->super_IRNode)._vptr_IRNode =
         (_func_int **)
         (pmVar4->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppVar2 = (pointer)(pmVar4->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_refcount._M_pi;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar2;
    _Var5._M_pi = extraout_RDX_00;
    if (ppVar2 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(ppVar2->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(ppVar2->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
  }
  sVar6.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::InterfaceRef>)
         sVar6.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<InterfaceRef> Generator::get_interface(const std::string &interface_name) const {
    return interfaces_.find(interface_name) != interfaces_.end() ? interfaces_.at(interface_name)
                                                                 : nullptr;
}